

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O2

void vocerr_va_prep(voccxdef *ctx,vocerr_va_info *info,int err,char *f,__va_list_tag *argptr)

{
  char cVar1;
  uchar uVar2;
  runsdef *prVar3;
  objnum objn;
  size_t sVar4;
  int len;
  char *pcVar5;
  int argc;
  typ_t tVar6;
  anon_union_8_3_d80c68c9_for_val *paVar7;
  int *piVar8;
  char *pcVar9;
  anon_union_8_3_d80c68c9_for_val *__s;
  argbuf_t *paVar10;
  uint uVar11;
  runcxdef *ctx_00;
  ulong __n;
  argbuf_t args [5];
  
  info->fmt = f;
  info->outp = info->user_msg;
  info->outsiz = 400;
  if (ctx->voccxper == 0xffff) {
    if (ctx->voccxperp == 0xffff) {
      return;
    }
    ctx_00 = ctx->voccxrun;
  }
  else {
    ctx_00 = ctx->voccxrun;
    if (ctx->voccxperp == 0xffff) {
      argc = 2;
      goto LAB_001f5408;
    }
  }
  paVar10 = args;
  pcVar5 = f;
  do {
    if (*pcVar5 == '%') {
      cVar1 = pcVar5[1];
      pcVar5 = pcVar5 + 1;
      if (cVar1 == 'c') {
        uVar11 = argptr->gp_offset;
        if ((ulong)uVar11 < 0x29) {
          pcVar9 = (char *)((ulong)uVar11 + (long)argptr->reg_save_area);
          argptr->gp_offset = uVar11 + 8;
        }
        else {
          pcVar9 = (char *)argptr->overflow_arg_area;
          argptr->overflow_arg_area = pcVar9 + 8;
        }
        (paVar10->val).charval = *pcVar9;
        tVar6 = ARGBUF_CHAR;
      }
      else if (cVar1 == 'd') {
        uVar11 = argptr->gp_offset;
        if ((ulong)uVar11 < 0x29) {
          piVar8 = (int *)((ulong)uVar11 + (long)argptr->reg_save_area);
          argptr->gp_offset = uVar11 + 8;
        }
        else {
          piVar8 = (int *)argptr->overflow_arg_area;
          argptr->overflow_arg_area = piVar8 + 2;
        }
        (paVar10->val).intval = *piVar8;
        tVar6 = ARGBUF_INT;
      }
      else {
        if (cVar1 != 's') goto LAB_001f5371;
        uVar11 = argptr->gp_offset;
        if ((ulong)uVar11 < 0x29) {
          paVar7 = (anon_union_8_3_d80c68c9_for_val *)((ulong)uVar11 + (long)argptr->reg_save_area);
          argptr->gp_offset = uVar11 + 8;
        }
        else {
          paVar7 = (anon_union_8_3_d80c68c9_for_val *)argptr->overflow_arg_area;
          argptr->overflow_arg_area = paVar7 + 1;
        }
        paVar10->val = *paVar7;
        tVar6 = ARGBUF_STR;
      }
      paVar10->typ = tVar6;
      paVar10 = paVar10 + 1;
    }
    else if (*pcVar5 == '\0') break;
LAB_001f5371:
    pcVar5 = pcVar5 + 1;
  } while( true );
  argc = 2;
  for (paVar7 = &paVar10[-1].val; (argbuf_t *)(paVar7 + 1) != args; paVar7 = paVar7 + -2) {
    tVar6 = ((argbuf_t *)(paVar7 + -1))->typ;
    if (tVar6 == ARGBUF_CHAR) {
      len = 1;
      __s = paVar7;
LAB_001f53e0:
      runpstr(ctx_00,&__s->charval,len,0);
    }
    else if (tVar6 == ARGBUF_INT) {
      runpnum(ctx_00,(long)paVar7->intval);
    }
    else if (tVar6 == ARGBUF_STR) {
      __s = (anon_union_8_3_d80c68c9_for_val *)paVar7->strval;
      sVar4 = strlen(&__s->charval);
      len = (int)sVar4;
      goto LAB_001f53e0;
    }
    argc = argc + 1;
  }
LAB_001f5408:
  sVar4 = strlen(f);
  runpstr(ctx_00,f,(int)sVar4,0);
  runpnum(ctx_00,(long)err);
  objn = ctx->voccxperp;
  if (objn == 0xffff) {
    objn = ctx->voccxper;
  }
  runfn(ctx_00,objn,argc);
  prVar3 = ctx_00->runcxsp;
  uVar2 = prVar3[-1].runstyp;
  ctx_00->runcxsp = prVar3 + -1;
  if (uVar2 == '\x03') {
    if (prVar3[-1].runstyp != '\x03') {
      ctx_00->runcxerr->errcxptr->erraac = 0;
      runsign(ctx_00,0x3ef);
    }
    uVar11 = *(ushort *)prVar3[-1].runsv.runsvstr - 2;
    if (0x18e < uVar11) {
      uVar11 = 399;
    }
    __n = (ulong)uVar11;
    memcpy(info,(ushort *)((long)prVar3[-1].runsv.runsvstr + 2),__n);
    info->user_msg[__n] = '\0';
    info->fmt = info->user_msg;
    info->outp = info->user_msg + __n + 1;
    info->outsiz = 399 - __n;
  }
  return;
}

Assistant:

static void vocerr_va_prep(voccxdef *ctx, struct vocerr_va_info *info,
                           int err, char *f, va_list argptr)
{
    /* 
     *   presume that we'll use the given format string, instead of one
     *   provided by the program 
     */
    info->fmt = f;

    /* use the output buffer from the info structure */
    info->outp = info->user_msg;
    info->outsiz = sizeof(info->user_msg);

    /* 
     *   if the user has a parseError or parseErrorParam function, see if it
     *   provides a msg 
     */
    if (ctx->voccxper != MCMONINV || ctx->voccxperp != MCMONINV)
    {
        runcxdef *rcx = ctx->voccxrun;
        dattyp    typ;
        size_t    len;
        int       argc;

        /* start off with the two arguments that are always present */
        argc = 2;

        /* 
         *   if we're calling parseErrorParam, and we have additional
         *   arguments, push them as well 
         */
        if (ctx->voccxperp != MCMONINV)
        {
            enum typ_t
            {
                ARGBUF_STR, ARGBUF_INT, ARGBUF_CHAR
            };
            struct argbuf_t
            {
                enum typ_t typ;
                union
                {
                    char *strval;
                    int   intval;
                    char  charval;
                } val;
            };
            struct argbuf_t  args[5];
            struct argbuf_t *argp;
            char  *p;

            /* 
             *   Retrieve the arguments by examining the format string.  We
             *   must buffer up the arguments before pushing them, because
             *   we need to push them in reverse order (last to first); so,
             *   we must scan all arguments before we push the first one.  
             */
            for (p = f, argp = args ; *p != '\0' ; ++p)
            {
                /* check if this is a parameter */
                if (*p == '%')
                {
                    /* find out what type it is */
                    switch(*++p)
                    {
                    case 's':
                        /* string - save the char pointer */
                        argp->val.strval = va_arg(argptr, char *);
                        argp->typ = ARGBUF_STR;

                        /* consume an argument slot */
                        ++argp;
                        break;

                    case 'd':
                        /* integer - save the integer */
                        argp->val.intval = va_arg(argptr, int);
                        argp->typ = ARGBUF_INT;

                        /* consume an argument slot */
                        ++argp;
                        break;

                    case 'c':
                        /* character */
                        argp->val.charval = (char)va_arg(argptr, int);
                        argp->typ = ARGBUF_CHAR;

                        /* consume an argument slot */
                        ++argp;
                        break;

                    default:
                        /* 
                         *   ignore other types (there shouldn't be any
                         *   other types anyway) 
                         */
                        break;
                    }
                }
            }

            /*
             *   Push the arguments - keep looping until we get back to the
             *   first argument slot 
             */
            while (argp != args)
            {
                /* move to the next argument, working backwards */
                --argp;

                /* push this argument */
                switch(argp->typ)
                {
                case ARGBUF_STR:
                    /* push the string value */
                    runpstr(rcx, argp->val.strval,
                            (int)strlen(argp->val.strval), 0);
                    break;

                case ARGBUF_INT:
                    /* push the number value */
                    runpnum(rcx, argp->val.intval);
                    break;

                case ARGBUF_CHAR:
                    /* push the character as a one-character string */
                    runpstr(rcx, &argp->val.charval, 1, 0);
                    break;
                }

                /* count the argument */
                ++argc;
            }
        }

        /* push standard arguments: error code and default message */
        runpstr(rcx, f, (int)strlen(f), 0);         /* 2nd arg: default msg */
        runpnum(rcx, (long)err);                   /* 1st arg: error number */

        /* invoke parseErrorParam if it's defined, otherwise parseError */
        runfn(rcx, (objnum)(ctx->voccxperp == MCMONINV
                            ? ctx->voccxper : ctx->voccxperp), argc);

        /* see what the function returned */
        typ = runtostyp(rcx);
        if (typ == DAT_SSTRING)
        {
            char *p;
            
            /* 
             *   they returned a string - use it as the error message
             *   instead of the default message 
             */
            p = (char *)runpopstr(rcx);
            len = osrp2(p) - 2;
            p += 2;
            if (len > sizeof(info->user_msg) - 1)
                len = sizeof(info->user_msg) - 1;
            memcpy(info->user_msg, p, len);
            info->user_msg[len] = '\0';

            /* use the returned string as the message to display */
            info->fmt = info->user_msg;

            /* use the remainder of the buffer for the final formatting */
            info->outp = info->user_msg + len + 1;
            info->outsiz = sizeof(info->user_msg) - len - 1;
        }
        else
        {
            /* ignore other return values */
            rundisc(rcx);
        }
    }

}